

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

golf_entity_t * golf_entity_make_copy(golf_entity_t *__return_storage_ptr__,golf_entity_t *entity)

{
  uint uVar1;
  golf_geo_point_t *pgVar2;
  vec_golf_geo_point_t points;
  vec_golf_geo_face_t faces;
  golf_geo_generator_data_t generator_data;
  int iVar3;
  golf_lightmap_section_t *pgVar4;
  golf_lightmap_section_t *section_00;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  golf_lightmap_section_t *pgVar10;
  undefined8 *puVar11;
  int i_1;
  ulong uVar12;
  golf_geo_t *pgVar13;
  int i;
  long lVar14;
  byte bVar15;
  vec2 *local_298;
  int aiStack_290 [2];
  char *local_288;
  vec2 *local_278;
  int aiStack_270 [2];
  char *local_268;
  undefined8 local_258;
  int aiStack_250 [2];
  char *local_248;
  char *local_238;
  undefined8 uStack_230;
  char *local_228;
  golf_script_t *local_218;
  undefined8 uStack_210;
  char *local_208;
  undefined8 uStack_200;
  char *local_1f8;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  golf_geo_t *local_1d8;
  golf_entity_t *local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  char *local_1b8;
  golf_geo_face_t face_copy;
  golf_lightmap_section_t section;
  char *local_b0;
  uint local_a8;
  vec3 local_94 [8];
  
  bVar15 = 0;
  memcpy(__return_storage_ptr__,entity,0x510);
  pgVar4 = golf_entity_get_lightmap_section(entity);
  section_00 = golf_entity_get_lightmap_section(__return_storage_ptr__);
  if (pgVar4 != (golf_lightmap_section_t *)0x0) {
    local_298 = (vec2 *)0x0;
    aiStack_290 = (int  [2])0x0;
    local_288 = "level";
    uVar1 = (pgVar4->uvs).length;
    iVar3 = vec_reserve_po2_((char **)&local_298,aiStack_290,aiStack_290 + 1,8,uVar1,"level");
    if (iVar3 == 0) {
      uVar5 = 0;
      uVar12 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar12 = 0;
      }
      for (; uVar12 != uVar5; uVar5 = uVar5 + 1) {
        lVar7 = (long)aiStack_290[0];
        aiStack_290[0] = aiStack_290[0] + 1;
        local_298[lVar7] = (pgVar4->uvs).data[uVar5];
      }
    }
    face_copy.material_name._15_8_ = local_288;
    face_copy._0_8_ = local_298;
    face_copy.material_name._7_8_ = aiStack_290;
    snprintf(section.lightmap_name,0x40,"%s",pgVar4);
    section.uvs.data = (vec2 *)face_copy._0_8_;
    section.uvs._8_8_ = face_copy.material_name._7_8_;
    section.uvs.alloc_category = (char *)face_copy.material_name._15_8_;
    pgVar4 = &section;
    pgVar10 = section_00;
    for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
      *(undefined8 *)pgVar10->lightmap_name = *(undefined8 *)pgVar4->lightmap_name;
      pgVar4 = (golf_lightmap_section_t *)((long)pgVar4 + (ulong)bVar15 * -0x10 + 8);
      pgVar10 = (golf_lightmap_section_t *)((long)pgVar10 + (ulong)bVar15 * -0x10 + 8);
    }
    golf_lightmap_section_finalize(section_00);
  }
  if (entity->type == WATER_ENTITY) {
    pgVar13 = &(entity->field_4).water.geo;
  }
  else if (entity->type == GEO_ENTITY) {
    pgVar13 = &(entity->field_4).geo.geo;
  }
  else {
    pgVar13 = (golf_geo_t *)0x0;
  }
  if (__return_storage_ptr__->type == WATER_ENTITY) {
    local_1d8 = (golf_geo_t *)((long)&__return_storage_ptr__->field_4 + 0x88);
  }
  else if (__return_storage_ptr__->type == GEO_ENTITY) {
    local_1d8 = (golf_geo_t *)((long)&__return_storage_ptr__->field_4 + 0xb0);
  }
  else {
    local_1d8 = (golf_geo_t *)0x0;
  }
  if (pgVar13 != (golf_geo_t *)0x0) {
    lVar7 = 0xc;
    local_208 = (char *)0x0;
    uStack_200 = 0;
    local_1f8 = "geo";
    local_1d0 = __return_storage_ptr__;
    for (lVar14 = 0; lVar14 < (pgVar13->points).length; lVar14 = lVar14 + 1) {
      pgVar2 = (pgVar13->points).data;
      local_218 = *(golf_script_t **)((long)pgVar2 + lVar7 + -8);
      section.lightmap_name._8_4_ = *(undefined4 *)(&pgVar2->active + lVar7);
      uStack_210 = 0;
      section.lightmap_name._0_4_ = SUB84(local_218,0);
      section.lightmap_name._4_4_ = SUB84(local_218,4);
      local_1e8 = CONCAT44(section.lightmap_name._8_4_,section.lightmap_name._4_4_);
      uStack_1e0 = 0;
      iVar3 = vec_expand_(&local_208,(int *)&uStack_200,(int *)((long)&uStack_200 + 4),0x10,
                          local_1f8);
      if (iVar3 == 0) {
        lVar8 = (long)(int)uStack_200;
        uStack_200 = CONCAT44(uStack_200._4_4_,(int)uStack_200 + 1);
        lVar8 = lVar8 * 0x10;
        pcVar9 = local_208 + lVar8;
        pcVar9[0] = '\x01';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        *(float *)(local_208 + lVar8 + 4) = local_218._0_4_;
        *(undefined8 *)(local_208 + lVar8 + 8) = local_1e8;
      }
      lVar7 = lVar7 + 0x10;
    }
    local_238 = (char *)0x0;
    uStack_230 = 0;
    local_228 = "geo";
    for (lVar7 = 0; lVar7 < (pgVar13->faces).length; lVar7 = lVar7 + 1) {
      memcpy(&section,(pgVar13->faces).data + lVar7,0x90);
      local_258 = (char *)0x0;
      aiStack_250[0] = 0;
      aiStack_250[1] = 0;
      local_248 = "face";
      uVar1 = (uint)section.uvs.alloc_category;
      iVar3 = vec_reserve_po2_((char **)&local_258,aiStack_250,aiStack_250 + 1,4,
                               (uint)section.uvs.alloc_category,"face");
      if (iVar3 == 0) {
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          lVar14 = (long)aiStack_250[0];
          aiStack_250[0] = aiStack_250[0] + 1;
          *(undefined4 *)(local_258 + lVar14 * 4) = *(undefined4 *)(section.uvs._8_8_ + uVar5 * 4);
        }
      }
      local_278 = (vec2 *)0x0;
      aiStack_270 = (int  [2])0x0;
      local_268 = "face";
      iVar3 = vec_reserve_po2_((char **)&local_278,aiStack_270,aiStack_270 + 1,8,local_a8,"face");
      if (iVar3 == 0) {
        uVar1 = local_a8;
        if ((int)local_a8 < 1) {
          uVar1 = 0;
        }
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          lVar14 = (long)aiStack_270[0];
          aiStack_270[0] = aiStack_270[0] + 1;
          local_278[lVar14] = *(vec2 *)(local_b0 + uVar5 * 8);
        }
      }
      local_218 = (golf_script_t *)local_94[0]._0_8_;
      local_1e8 = CONCAT44(local_1e8._4_4_,local_94[0].z);
      local_288 = local_268;
      local_298 = local_278;
      aiStack_290[0] = aiStack_270[0];
      aiStack_290[1] = aiStack_270[1];
      local_1c8 = (undefined4)local_258;
      uStack_1c4 = local_258._4_4_;
      iStack_1c0 = aiStack_250[0];
      iStack_1bc = aiStack_250[1];
      local_1b8 = local_248;
      face_copy.active = true;
      snprintf(face_copy.material_name,0x40,"%s",section.lightmap_name + 1);
      face_copy.idx.alloc_category = local_1b8;
      face_copy.idx.data = (int *)CONCAT44(uStack_1c4,local_1c8);
      face_copy.idx.capacity = iStack_1bc;
      face_copy.idx.length = iStack_1c0;
      face_copy.uvs.alloc_category = local_288;
      face_copy.uvs.data = local_298;
      face_copy.uvs.length = aiStack_290[0];
      face_copy.uvs.capacity = aiStack_290[1];
      face_copy.start_vertex_in_model = 0;
      face_copy.water_dir._0_8_ = local_218;
      face_copy.water_dir.z = (float)local_1e8;
      iVar3 = vec_expand_(&local_238,(int *)&uStack_230,(int *)((long)&uStack_230 + 4),0x90,
                          local_228);
      if (iVar3 == 0) {
        lVar14 = (long)(int)uStack_230;
        uStack_230 = CONCAT44(uStack_230._4_4_,(int)uStack_230 + 1);
        memcpy(local_238 + lVar14 * 0x90,&face_copy,0x90);
      }
    }
    local_218 = (pgVar13->generator_data).script;
    section.lightmap_name[0] = '\0';
    section.lightmap_name[1] = '\0';
    section.lightmap_name[2] = '\0';
    section.lightmap_name[3] = '\0';
    section.lightmap_name[4] = '\0';
    section.lightmap_name[5] = '\0';
    section.lightmap_name[6] = '\0';
    section.lightmap_name[7] = '\0';
    section.lightmap_name[8] = '\0';
    section.lightmap_name[9] = '\0';
    section.lightmap_name[10] = '\0';
    section.lightmap_name[0xb] = '\0';
    section.lightmap_name[0xc] = '\0';
    section.lightmap_name[0xd] = '\0';
    section.lightmap_name[0xe] = '\0';
    section.lightmap_name[0xf] = '\0';
    section.lightmap_name._16_8_ = anon_var_dwarf_ad20;
    lVar7 = 0;
    for (lVar14 = 0; lVar14 < (pgVar13->generator_data).args.length; lVar14 = lVar14 + 1) {
      iVar3 = vec_expand_((char **)&section,(int *)(section.lightmap_name + 8),
                          (int *)(section.lightmap_name + 0xc),0x58,
                          (char *)section.lightmap_name._16_8_);
      if (iVar3 == 0) {
        lVar6 = (long)(int)section.lightmap_name._8_4_;
        section.lightmap_name._8_4_ = section.lightmap_name._8_4_ + 1;
        pcVar9 = ((pgVar13->generator_data).args.data)->name + lVar7;
        puVar11 = (undefined8 *)
                  (lVar6 * 0x58 + CONCAT44(section.lightmap_name._4_4_,section.lightmap_name._0_4_))
        ;
        for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar11 = *(undefined8 *)pcVar9;
          pcVar9 = pcVar9 + ((ulong)bVar15 * -2 + 1) * 8;
          puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
        }
      }
      lVar7 = lVar7 + 0x58;
    }
    face_copy.material_name[0x17] = section.lightmap_name[0x10];
    face_copy.material_name[0x18] = section.lightmap_name[0x11];
    face_copy.material_name[0x19] = section.lightmap_name[0x12];
    face_copy.material_name[0x1a] = section.lightmap_name[0x13];
    face_copy.material_name[0x1b] = section.lightmap_name[0x14];
    face_copy.material_name[0x1c] = section.lightmap_name[0x15];
    face_copy.material_name[0x1d] = section.lightmap_name[0x16];
    face_copy.material_name[0x1e] = section.lightmap_name[0x17];
    face_copy.material_name[0xb] = section.lightmap_name[4];
    face_copy.material_name[0xc] = section.lightmap_name[5];
    face_copy.material_name[0xd] = section.lightmap_name[6];
    face_copy.material_name[0xe] = section.lightmap_name[7];
    face_copy.material_name[7] = section.lightmap_name[0];
    face_copy.material_name[8] = section.lightmap_name[1];
    face_copy.material_name[9] = section.lightmap_name[2];
    face_copy.material_name[10] = section.lightmap_name[3];
    face_copy.material_name[0x13] = section.lightmap_name[0xc];
    face_copy.material_name[0x14] = section.lightmap_name[0xd];
    face_copy.material_name[0x15] = section.lightmap_name[0xe];
    face_copy.material_name[0x16] = section.lightmap_name[0xf];
    face_copy.material_name[0xf] = section.lightmap_name[8];
    face_copy.material_name[0x10] = section.lightmap_name[9];
    face_copy.material_name[0x11] = section.lightmap_name[10];
    face_copy.material_name[0x12] = section.lightmap_name[0xb];
    face_copy._0_8_ = local_218;
    points.length = (int)uStack_200;
    points.capacity = uStack_200._4_4_;
    points.data = (golf_geo_point_t *)local_208;
    points.alloc_category = local_1f8;
    faces.length = (int)uStack_230;
    faces.capacity = uStack_230._4_4_;
    faces.data = (golf_geo_face_t *)local_238;
    faces.alloc_category = local_228;
    generator_data.args.data = (golf_geo_generator_data_arg_t *)face_copy.material_name._7_8_;
    generator_data.script = local_218;
    generator_data.args._8_8_ = face_copy.material_name._15_8_;
    generator_data.args.alloc_category = (char *)section.lightmap_name._16_8_;
    golf_geo((golf_geo_t *)&section,points,faces,generator_data,pgVar13->is_water);
    pgVar13 = local_1d8;
    memcpy(local_1d8,(golf_geo_t *)&section,0xe8);
    golf_geo_finalize(pgVar13);
    __return_storage_ptr__ = local_1d0;
  }
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_make_copy(golf_entity_t *entity) {
    golf_entity_t entity_copy = *entity;

    golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
    golf_lightmap_section_t *lightmap_section_copy = golf_entity_get_lightmap_section(&entity_copy);
    if (lightmap_section) {
        vec_vec2_t uvs_copy;
        vec_init(&uvs_copy, "level");
        vec_pusharr(&uvs_copy, lightmap_section->uvs.data, lightmap_section->uvs.length);
        *lightmap_section_copy = golf_lightmap_section(lightmap_section->lightmap_name, uvs_copy);
        golf_lightmap_section_finalize(lightmap_section_copy);
    }

    golf_geo_t *geo = golf_entity_get_geo(entity);
    golf_geo_t *geo_copy = golf_entity_get_geo(&entity_copy);
    if (geo) {
        vec_golf_geo_point_t points_copy;
        vec_init(&points_copy, "geo");
        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t point = geo->points.data[i];
            golf_geo_point_t point_copy = golf_geo_point(point.position);
            vec_push(&points_copy, point_copy);
        }

        vec_golf_geo_face_t faces_copy;
        vec_init(&faces_copy, "geo");
        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];

            vec_int_t idx_copy;
            vec_init(&idx_copy, "face");
            vec_pusharr(&idx_copy, face.idx.data, face.idx.length);

            vec_vec2_t uvs_copy;
            vec_init(&uvs_copy, "face");
            vec_pusharr(&uvs_copy, face.uvs.data, face.uvs.length);

            golf_geo_face_t face_copy = golf_geo_face(face.material_name, idx_copy, face.uv_gen_type, uvs_copy, face.water_dir);
            vec_push(&faces_copy, face_copy);
        }

        golf_geo_generator_data_t generator_data_copy;
        {
            golf_script_t *script = geo->generator_data.script;
            vec_golf_geo_generator_data_arg_t args;
            vec_init(&args, "geo");
            for (int i = 0; i < geo->generator_data.args.length; i++) {
                vec_push(&args, geo->generator_data.args.data[i]);
            }
            generator_data_copy = golf_geo_generator_data(script, args);
        }

        *geo_copy = golf_geo(points_copy, faces_copy, generator_data_copy, geo->is_water);
        golf_geo_finalize(geo_copy);
    }

    return entity_copy;
}